

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void * __thiscall tinyxml2::MemPoolT<96>::Alloc(MemPoolT<96> *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  Chunk *pCVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar7;
  
  if (this->_root == (Chunk *)0x0) {
    pCVar4 = (Chunk *)operator_new(0xfc0);
    lVar5 = 0;
    memset(pCVar4,0,0xfc0);
    DynArray<tinyxml2::MemPoolT<96>::Block_*,_10>::EnsureCapacity
              (&this->_blockPtrs,(this->_blockPtrs)._size + 1);
    iVar1 = (this->_blockPtrs)._size;
    (this->_blockPtrs)._size = iVar1 + 1;
    (this->_blockPtrs)._mem[iVar1] = (Block *)pCVar4;
    auVar3 = _DAT_001ea020;
    auVar6 = _DAT_001eb470;
    do {
      lVar7 = auVar6._8_8_;
      if (SUB164(auVar6 ^ auVar3,4) == -0x80000000 && SUB164(auVar6 ^ auVar3,0) < -0x7fffffd7) {
        *(Chunk **)((long)pCVar4 + lVar5) = pCVar4 + auVar6._0_8_ + 1;
        *(Chunk **)((long)pCVar4 + lVar5 + 0x60) = pCVar4 + lVar7 + 1;
      }
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0xc0;
    } while (lVar5 != 0xfc0);
    pCVar4[0x29].next = (Chunk *)0x0;
    this->_root = pCVar4;
  }
  pCVar4 = this->_root;
  this->_root = pCVar4->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return pCVar4;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }